

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableCopy(PrintExpressionContents *this,TableCopy *curr)

{
  ostream *o;
  string_view local_28;
  TableCopy *local_18;
  TableCopy *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (TableCopy *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"table.copy ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->destTable,this->o);
  std::operator<<(this->o,' ');
  wasm::Name::print(&local_18->sourceTable,this->o);
  return;
}

Assistant:

void visitTableCopy(TableCopy* curr) {
    printMedium(o, "table.copy ");
    curr->destTable.print(o);
    o << ' ';
    curr->sourceTable.print(o);
  }